

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

void __thiscall
HighsLinearSumBounds::updatedImplVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldImplVarUpper,HighsInt oldImplVarUpperSource)

{
  int *piVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  HighsCDouble *this_00;
  double dVar5;
  double local_20;
  
  local_20 = oldImplVarUpper;
  pdVar3 = this->varUpper;
  pdVar4 = pdVar3 + var;
  if ((oldImplVarUpperSource != sum) && (oldImplVarUpper < *pdVar4 || oldImplVarUpper == *pdVar4)) {
    pdVar4 = &local_20;
  }
  dVar2 = *pdVar4;
  if (this->implVarUpperSource[var] == sum) {
    dVar5 = pdVar3[var];
  }
  else {
    dVar5 = pdVar3[var];
    if (this->implVarUpper[var] <= pdVar3[var]) {
      dVar5 = this->implVarUpper[var];
    }
  }
  if ((dVar5 != dVar2) || (NAN(dVar5) || NAN(dVar2))) {
    if (coefficient <= 0.0) {
      if (dVar2 < INFINITY) {
        HighsCDouble::operator-=
                  ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (dVar5 < INFINITY) {
        this_00 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start + sum;
        goto LAB_0035e3d8;
      }
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
    else {
      if (dVar2 < INFINITY) {
        HighsCDouble::operator-=
                  ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar2 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (dVar5 < INFINITY) {
        this_00 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                  _M_impl.super__Vector_impl_data._M_start + sum;
LAB_0035e3d8:
        HighsCDouble::operator+=(this_00,dVar5 * coefficient);
        return;
      }
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void HighsLinearSumBounds::updatedImplVarUpper(HighsInt sum, HighsInt var,
                                               double coefficient,
                                               double oldImplVarUpper,
                                               HighsInt oldImplVarUpperSource) {
  double oldVUpper = oldImplVarUpperSource == sum
                         ? varUpper[var]
                         : std::min(oldImplVarUpper, varUpper[var]);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (vUpper == oldVUpper) return;

  if (coefficient > 0) {
    if (oldVUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= oldVUpper * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;
  } else {
    if (oldVUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= oldVUpper * coefficient;

    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;
  }
}